

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool server::searchmodename(char *haystack,char *needle)

{
  char *pcVar1;
  bool bVar2;
  char *local_30;
  char *n;
  char *h;
  char *needle_local;
  char *haystack_local;
  
  needle_local = haystack;
  if (*needle == '\0') {
    haystack_local._7_1_ = true;
  }
  else {
    do {
      if (*needle != '.') {
        pcVar1 = strchr(needle_local,(int)*needle);
        if (pcVar1 == (char *)0x0) break;
        needle_local = pcVar1 + 1;
      }
      n = needle_local;
      local_30 = needle + 1;
      while( true ) {
        bVar2 = false;
        if (*n != '\0') {
          bVar2 = *local_30 != '\0';
        }
        if (!bVar2) break;
        if (*n == *local_30) {
          local_30 = local_30 + 1;
        }
        else if (*n != ' ') break;
        n = n + 1;
      }
      if (*local_30 == '\0') {
        return true;
      }
      if (*local_30 == '.') {
        return *n == '\0';
      }
    } while (*needle != '.');
    haystack_local._7_1_ = false;
  }
  return haystack_local._7_1_;
}

Assistant:

bool searchmodename(const char *haystack, const char *needle)
    {
        if(!needle[0]) return true;
        do
        {
            if(needle[0] != '.')
            {
                haystack = strchr(haystack, needle[0]);
                if(!haystack) break;
                haystack++;
            }
            const char *h = haystack, *n = needle+1;
            for(; *h && *n; h++)
            {
                if(*h == *n) n++;
                else if(*h != ' ') break;
            }
            if(!*n) return true;
            if(*n == '.') return !*h;
        } while(needle[0] != '.');
        return false;
    }